

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Remote.cpp
# Opt level: O1

void XPMP2::RemoteAcRemove(Aircraft *ac)

{
  XPMPPlaneID XVar1;
  char cVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
  pVar5;
  XPMPPlaneID local_1c;
  
  cVar2 = glockRmtData[8];
  if (DAT_002ef77c == 2) {
    if (glockRmtData[8] == '\0') {
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)glockRmtData);
    }
    p_Var3 = (_List_node_base *)operator_new(0x10);
    XVar1 = ac->modeS_id;
    *(undefined1 *)&p_Var3->_M_prev = 6;
    p_Var3->_M_next = (_List_node_base *)&PTR__RmtDataBaseTy_002e07a8;
    *(XPMPPlaneID *)((long)&p_Var3->_M_prev + 1) = XVar1;
    p_Var4 = (_List_node_base *)operator_new(0x18);
    p_Var4[1]._M_next = p_Var3;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    _DAT_002ef2b8 = _DAT_002ef2b8 + 1;
    local_1c = ac->modeS_id;
    pVar5 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
            ::equal_range((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
                           *)gmapRmtAcCache,&local_1c);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
    ::_M_erase_aux((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
                    *)gmapRmtAcCache,(_Base_ptr)pVar5.first._M_node,(_Base_ptr)pVar5.second._M_node)
    ;
    if (cVar2 == '\0') {
      std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)glockRmtData);
    }
  }
  else if (gmapRmtAcCache._40_8_ != 0) {
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
    ::clear((_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>,_std::_Select1st<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_XPMP2::RmtAcCacheTy>_>_>
             *)gmapRmtAcCache);
    return;
  }
  return;
}

Assistant:

void RemoteAcRemove (const Aircraft& ac)
{
    // Can only do anything reasonable if we are to send data
    if (glob.remoteStatus != REMOTE_SENDING) {
        if (!gmapRmtAcCache.empty())           // that's faster than searching for the individual plane...
            gmapRmtAcCache.clear();            // when we are not/no longer sending then the cache is outdated anyway
        return;
    }
    
    // We need the mutex to add to the queue
    bool bDidLock = false;                      // this isn't the most safe solution...but a recursive_mutex doesn't work with the condition variable used to notify the network thread
    if (!glockRmtData) {
        glockRmtData.lock();
        bDidLock = true;
    }
    
    // Add the plane id to the queue, marked for removal
    gqueueRmtData.emplace(new RmtDataAcRemoveTy(RemoteAcRemoveTy(ac.GetModeS_ID())));
    
    // Remove the plane from the cache
    gmapRmtAcCache.erase(ac.GetModeS_ID());
    
    // Undo the lock if we locked earlier
    if (bDidLock)
        glockRmtData.unlock();
}